

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateTemplateNode::TemplateTemplateNode
          (TemplateTemplateNode *this,TemplateToken *token,Strip strip,string *indentation)

{
  ostream *poVar1;
  ulong uVar2;
  char *pcVar3;
  size_t val_len;
  ModifierAndValue local_78;
  allocator local_59;
  string local_58 [48];
  string *local_28;
  string *indentation_local;
  TemplateToken *pTStack_18;
  Strip strip_local;
  TemplateToken *token_local;
  TemplateTemplateNode *this_local;
  
  local_28 = indentation;
  indentation_local._4_4_ = strip;
  pTStack_18 = token;
  token_local = (TemplateToken *)this;
  TemplateNode::TemplateNode(&this->super_TemplateNode);
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__TemplateTemplateNode_001b5170;
  TemplateToken::TemplateToken(&this->token_,pTStack_18);
  anon_unknown_14::HashedTemplateString::HashedTemplateString
            (&this->variable_,(this->token_).text,(this->token_).textlen);
  this->strip_ = indentation_local._4_4_;
  std::__cxx11::string::string((string *)&this->indentation_,(string *)local_28);
  if (1 < kVerbosity) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"2: ");
    poVar1 = std::operator<<(poVar1,"Constructing TemplateTemplateNode: ");
    pcVar3 = (this->token_).text;
    uVar2 = (this->token_).textlen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar3,uVar2,&local_59);
    poVar1 = std::operator<<(poVar1,local_58);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::data();
    val_len = std::__cxx11::string::length();
    ModifierAndValue::ModifierAndValue
              (&local_78,(ModifierInfo *)(anonymous_namespace)::g_prefix_line_info,pcVar3,val_len);
    std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
    push_back(&(this->token_).modvals,&local_78);
  }
  return;
}

Assistant:

explicit TemplateTemplateNode(const TemplateToken& token, Strip strip,
                                const string& indentation)
      : token_(token),
        variable_(token_.text, token_.textlen),
        strip_(strip), indentation_(indentation) {
    VLOG(2) << "Constructing TemplateTemplateNode: "
            << string(token_.text, token_.textlen) << endl;

    // If this template is indented (eg, " {{>SUBTPL}}"), make sure
    // every line of the expanded template is indented, not just the
    // first one.  We do this by adding a modifier that applies to
    // the entire template node, that inserts spaces after newlines.
    if (!indentation_.empty()) {
      token_.modvals.push_back(ModifierAndValue(&g_prefix_line_info,
                                                indentation_.data(),
                                                indentation_.length()));
    }
  }